

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O2

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>::TPZMultiphysicsCompEl
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoCube> *this,TPZCompMesh *mesh,
          TPZMultiphysicsCompEl<pzgeom::TPZGeoCube> *copy)

{
  *(undefined ***)&(this->super_TPZMultiphysicsElement).super_TPZCompEl = &PTR__TPZSavable_01778398;
  TPZMultiphysicsElement::TPZMultiphysicsElement
            (&this->super_TPZMultiphysicsElement,&PTR_PTR_01775788,mesh,
             &copy->super_TPZMultiphysicsElement);
  *(undefined ***)&(this->super_TPZMultiphysicsElement).super_TPZCompEl =
       &PTR__TPZMultiphysicsCompEl_01775478;
  TPZManVector<TPZCompElSide,_5>::TPZManVector(&this->fElementVec,0);
  TPZVec<long>::TPZVec(&this->fConnectIndexes,&copy->fConnectIndexes);
  TPZIntCube3D::TPZIntCube3D(&this->fIntRule,&copy->fIntRule);
  return;
}

Assistant:

TPZMultiphysicsCompEl<TGeometry>::TPZMultiphysicsCompEl(TPZCompMesh &mesh, const TPZMultiphysicsCompEl<TGeometry> &copy) : TPZRegisterClassId(&TPZMultiphysicsCompEl::ClassId),
TPZMultiphysicsElement(mesh,copy),
fConnectIndexes(copy.fConnectIndexes),  fIntRule(copy.fIntRule)
{
#ifdef PZDEBUG
    TPZMaterial * material = Material();
    if(!material){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " this->Material() == NULL\n";
        return;
    }
#endif
    
}